

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O2

int ARKStepSetOptimalParams(void *arkode_mem)

{
  ARKodeHAdaptMem pAVar1;
  int iVar2;
  SUNAdaptController p_Var3;
  int error_code;
  char *msgfmt;
  undefined4 uVar4;
  undefined4 uVar5;
  sunrealtype sVar6;
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  long leniw;
  long lenrw;
  
  iVar2 = arkStep_AccessARKODEStepMem(arkode_mem,"ARKStepSetOptimalParams",&ark_mem,&step_mem);
  if (iVar2 != 0) {
    return iVar2;
  }
  pAVar1 = ark_mem->hadapt_mem;
  if (pAVar1 == (ARKodeHAdaptMem)0x0) {
    msgfmt = "Adaptivity memory structure not allocated.";
    error_code = -0x15;
    iVar2 = 0x5ba;
  }
  else {
    iVar2 = SUNAdaptController_Space(pAVar1->hcontroller,&lenrw,&leniw);
    if (iVar2 == 0) {
      ark_mem->liw = ark_mem->liw - leniw;
      ark_mem->lrw = ark_mem->lrw - lenrw;
    }
    if (pAVar1->owncontroller != 0) {
      iVar2 = SUNAdaptController_Destroy(pAVar1->hcontroller);
      ark_mem->hadapt_mem->owncontroller = 0;
      if (iVar2 != 0) {
        msgfmt = "SUNAdaptController_Destroy failure";
        error_code = -0x14;
        iVar2 = 0x5cd;
        goto LAB_00120507;
      }
    }
    pAVar1->hcontroller = (SUNAdaptController)0x0;
    if (step_mem->explicit == 0) {
      if (step_mem->implicit == 0) goto LAB_001205da;
      error_code = 0;
      switch(step_mem->q) {
      case 2:
        p_Var3 = SUNAdaptController_PID(ark_mem->sunctx);
        pAVar1->hcontroller = p_Var3;
        if (p_Var3 != (SUNAdaptController)0x0) {
          pAVar1->safety = 0.9;
          pAVar1->growth = 20.0;
          pAVar1->etamxf = 0.3;
          pAVar1->small_nef = 2;
          pAVar1->etacf = 0.25;
          pAVar1->pq = 0;
          step_mem->nlscoef = 0.001;
          step_mem->maxcor = 5;
          step_mem->crdown = 0.3;
          step_mem->rdiv = 2.3;
          step_mem->dgmax = 0.2;
          step_mem->msbp = 0x14;
          return 0;
        }
        msgfmt = "SUNAdaptController_PID allocation failure";
        error_code = -0x14;
        iVar2 = 0x5f3;
        break;
      case 3:
        p_Var3 = SUNAdaptController_I(ark_mem->sunctx);
        pAVar1->hcontroller = p_Var3;
        if (p_Var3 != (SUNAdaptController)0x0) {
          SUNAdaptController_SetErrorBias(0x66666666,p_Var3);
          pAVar1->safety = 0.957;
          pAVar1->growth = 17.6;
          pAVar1->etamxf = 0.45;
          pAVar1->small_nef = 2;
          pAVar1->etacf = 0.25;
          pAVar1->pq = 0;
          step_mem->nlscoef = 0.22;
          step_mem->crdown = 0.17;
          step_mem->rdiv = 2.3;
          step_mem->dgmax = 0.19;
          step_mem->msbp = 0x3c;
          return 0;
        }
        msgfmt = "SUNAdaptController_I allocation failure";
        error_code = -0x14;
        iVar2 = 0x608;
        break;
      case 4:
        p_Var3 = SUNAdaptController_PID(ark_mem->sunctx);
        pAVar1->hcontroller = p_Var3;
        if (p_Var3 != (SUNAdaptController)0x0) {
          SUNAdaptController_SetErrorBias(0x33333333,p_Var3);
          SUNAdaptController_SetParams_PID(pAVar1->hcontroller,0.535,-0.209,0.148);
          pAVar1->safety = 0.988;
          pAVar1->growth = 31.5;
          pAVar1->etamxf = 0.33;
          pAVar1->small_nef = 2;
          pAVar1->etacf = 0.25;
          pAVar1->pq = 0;
          step_mem->nlscoef = 0.24;
          step_mem->crdown = 0.26;
          step_mem->rdiv = 2.3;
          step_mem->dgmax = 0.16;
          step_mem->msbp = 0x1f;
          return 0;
        }
        msgfmt = "SUNAdaptController_PID allocation failure";
        error_code = -0x14;
        iVar2 = 0x61e;
        break;
      case 5:
        p_Var3 = SUNAdaptController_PID(ark_mem->sunctx);
        pAVar1->hcontroller = p_Var3;
        if (p_Var3 != (SUNAdaptController)0x0) {
          SUNAdaptController_SetErrorBias(0x66666666,p_Var3);
          SUNAdaptController_SetParams_PID(pAVar1->hcontroller,0.56,-0.338,0.14);
          pAVar1->safety = 0.937;
          pAVar1->growth = 22.0;
          pAVar1->etamxf = 0.44;
          pAVar1->small_nef = 2;
          pAVar1->etacf = 0.25;
          pAVar1->pq = 0;
          step_mem->nlscoef = 0.25;
          step_mem->crdown = 0.4;
          step_mem->rdiv = 2.3;
          step_mem->dgmax = 0.32;
          step_mem->msbp = 0x1f;
          return 0;
        }
        msgfmt = "SUNAdaptController_PID allocation failure";
        error_code = -0x14;
        iVar2 = 0x638;
        break;
      default:
        goto switchD_0012053b_default;
      }
    }
    else if (step_mem->implicit == 0) {
      p_Var3 = SUNAdaptController_PI(ark_mem->sunctx);
      pAVar1->hcontroller = p_Var3;
      if (p_Var3 != (SUNAdaptController)0x0) {
        SUNAdaptController_SetErrorBias(0x33333333,p_Var3);
        SUNAdaptController_SetParams_PI(pAVar1->hcontroller,0.8,-0.31);
        pAVar1->safety = 0.99;
        pAVar1->growth = 25.0;
        pAVar1->etamxf = 0.3;
        pAVar1->pq = 0;
        return 0;
      }
      msgfmt = "SUNAdaptController_PI allocation failure";
      error_code = -0x14;
      iVar2 = 0x5dc;
    }
    else {
LAB_001205da:
      switch(step_mem->q) {
      case 2:
        p_Var3 = SUNAdaptController_PID(ark_mem->sunctx);
        pAVar1->hcontroller = p_Var3;
        if (p_Var3 != (SUNAdaptController)0x0) {
          pAVar1->safety = 0.9;
          pAVar1->growth = 20.0;
          pAVar1->etamxf = 0.3;
          pAVar1->small_nef = 2;
          pAVar1->etacf = 0.25;
          pAVar1->pq = 0;
          step_mem->nlscoef = 0.001;
          step_mem->maxcor = 5;
          iVar2 = 0x14;
          uVar4 = 0x9999999a;
          uVar5 = 0x3fc99999;
          sVar6 = 0.3;
LAB_00120873:
          step_mem->crdown = sVar6;
          step_mem->rdiv = 2.3;
          step_mem->dgmax = (sunrealtype)CONCAT44(uVar5,uVar4);
          step_mem->msbp = iVar2;
switchD_001205f7_default:
          pAVar1->owncontroller = 1;
          iVar2 = SUNAdaptController_Space(pAVar1->hcontroller,&lenrw,&leniw);
          if (iVar2 != 0) {
            return 0;
          }
          ark_mem->liw = ark_mem->liw + leniw;
          ark_mem->lrw = ark_mem->lrw + lenrw;
          return 0;
        }
        msgfmt = "SUNAdaptController_PID allocation failure";
        error_code = -0x14;
        iVar2 = 0x659;
        break;
      case 3:
        p_Var3 = SUNAdaptController_PID(ark_mem->sunctx);
        pAVar1->hcontroller = p_Var3;
        if (p_Var3 != (SUNAdaptController)0x0) {
          SUNAdaptController_SetErrorBias(0xeb851eb8,p_Var3);
          SUNAdaptController_SetParams_PID(pAVar1->hcontroller,0.54,-0.36,0.14);
          pAVar1->safety = 0.965;
          pAVar1->growth = 28.7;
          pAVar1->etamxf = 0.46;
          pAVar1->small_nef = 2;
          pAVar1->etacf = 0.25;
          pAVar1->pq = 0;
          step_mem->nlscoef = 0.22;
          iVar2 = 0x3c;
          uVar4 = 0x851eb852;
          uVar5 = 0x3fc851eb;
          sVar6 = 0.17;
          goto LAB_00120873;
        }
        msgfmt = "SUNAdaptController_PID allocation failure";
        error_code = -0x14;
        iVar2 = 0x66e;
        break;
      case 4:
        p_Var3 = SUNAdaptController_PID(ark_mem->sunctx);
        pAVar1->hcontroller = p_Var3;
        if (p_Var3 != (SUNAdaptController)0x0) {
          SUNAdaptController_SetErrorBias(0x9999999a,p_Var3);
          SUNAdaptController_SetParams_PID(pAVar1->hcontroller,0.543,-0.297,0.14);
          pAVar1->safety = 0.97;
          pAVar1->growth = 25.0;
          pAVar1->etamxf = 0.47;
          pAVar1->small_nef = 2;
          pAVar1->etacf = 0.25;
          pAVar1->pq = 0;
          step_mem->nlscoef = 0.24;
          iVar2 = 0x1f;
          uVar4 = 0x47ae147b;
          uVar5 = 0x3fc47ae1;
          sVar6 = 0.26;
          goto LAB_00120873;
        }
        msgfmt = "SUNAdaptController_PID allocation failure";
        error_code = -0x14;
        iVar2 = 0x687;
        break;
      case 5:
        p_Var3 = SUNAdaptController_PI(ark_mem->sunctx);
        pAVar1->hcontroller = p_Var3;
        if (p_Var3 != (SUNAdaptController)0x0) {
          SUNAdaptController_SetErrorBias(0x66666666,p_Var3);
          SUNAdaptController_SetParams_PI(pAVar1->hcontroller,0.8,-0.35);
          pAVar1->safety = 0.993;
          pAVar1->growth = 28.5;
          pAVar1->etamxf = 0.3;
          pAVar1->small_nef = 2;
          pAVar1->etacf = 0.25;
          pAVar1->pq = 0;
          step_mem->nlscoef = 0.25;
          iVar2 = 0x1f;
          uVar4 = 0x47ae147b;
          uVar5 = 0x3fd47ae1;
          sVar6 = 0.4;
          goto LAB_00120873;
        }
        msgfmt = "SUNAdaptController_PI allocation failure";
        error_code = -0x14;
        iVar2 = 0x6a1;
        break;
      default:
        goto switchD_001205f7_default;
      }
    }
  }
LAB_00120507:
  arkProcessError(ark_mem,error_code,iVar2,"ARKStepSetOptimalParams",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_io.c"
                  ,msgfmt);
switchD_0012053b_default:
  return error_code;
}

Assistant:

int ARKStepSetOptimalParams(void* arkode_mem)
{
  /* TODO: do we need to do something here? This is deprecated with no
   * ARKodeSetOptimalParams to replace it */
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  ARKodeHAdaptMem hadapt_mem;
  int retval;
  long int lenrw, leniw;

  /* access ARKodeMem and ARKodeARKStepMem structures */
  retval = arkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* access ARKodeHAdaptMem structure */
  if (ark_mem->hadapt_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARKADAPT_NO_MEM);
    return (ARK_MEM_NULL);
  }
  hadapt_mem = ark_mem->hadapt_mem;

  /* Remove current SUNAdaptController object */
  retval = SUNAdaptController_Space(hadapt_mem->hcontroller, &lenrw, &leniw);
  if (retval == SUN_SUCCESS)
  {
    ark_mem->liw -= leniw;
    ark_mem->lrw -= lenrw;
  }
  if (hadapt_mem->owncontroller)
  {
    retval = SUNAdaptController_Destroy(hadapt_mem->hcontroller);
    ark_mem->hadapt_mem->owncontroller = SUNFALSE;
    if (retval != SUN_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "SUNAdaptController_Destroy failure");
      return (ARK_MEM_FAIL);
    }
  }
  hadapt_mem->hcontroller = NULL;

  /* Choose values based on method, order */

  /*    explicit */
  if (step_mem->explicit && !step_mem->implicit)
  {
    hadapt_mem->hcontroller = SUNAdaptController_PI(ark_mem->sunctx);
    if (hadapt_mem->hcontroller == NULL)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "SUNAdaptController_PI allocation failure");
      return (ARK_MEM_FAIL);
    }
    (void)SUNAdaptController_SetErrorBias(hadapt_mem->hcontroller,
                                          SUN_RCONST(1.2));
    (void)SUNAdaptController_SetParams_PI(hadapt_mem->hcontroller,
                                          SUN_RCONST(0.8), -SUN_RCONST(0.31));
    hadapt_mem->safety = SUN_RCONST(0.99);
    hadapt_mem->growth = SUN_RCONST(25.0);
    hadapt_mem->etamxf = SUN_RCONST(0.3);
    hadapt_mem->pq     = PQ;

    /*    implicit */
  }
  else if (step_mem->implicit && !step_mem->explicit)
  {
    switch (step_mem->q)
    {
    case 2: /* just use standard defaults since better ones unknown */
      hadapt_mem->hcontroller = SUNAdaptController_PID(ark_mem->sunctx);
      if (hadapt_mem->hcontroller == NULL)
      {
        arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                        "SUNAdaptController_PID allocation failure");
        return (ARK_MEM_FAIL);
      }
      hadapt_mem->safety    = SAFETY;
      hadapt_mem->growth    = GROWTH;
      hadapt_mem->etamxf    = ETAMXF;
      hadapt_mem->small_nef = SMALL_NEF;
      hadapt_mem->etacf     = ETACF;
      hadapt_mem->pq        = PQ;
      step_mem->nlscoef     = SUN_RCONST(0.001);
      step_mem->maxcor      = 5;
      step_mem->crdown      = CRDOWN;
      step_mem->rdiv        = RDIV;
      step_mem->dgmax       = DGMAX;
      step_mem->msbp        = MSBP;
      break;
    case 3:
      hadapt_mem->hcontroller = SUNAdaptController_I(ark_mem->sunctx);
      if (hadapt_mem->hcontroller == NULL)
      {
        arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                        "SUNAdaptController_I allocation failure");
        return (ARK_MEM_FAIL);
      }
      (void)SUNAdaptController_SetErrorBias(hadapt_mem->hcontroller,
                                            SUN_RCONST(1.9));
      hadapt_mem->safety    = SUN_RCONST(0.957);
      hadapt_mem->growth    = SUN_RCONST(17.6);
      hadapt_mem->etamxf    = SUN_RCONST(0.45);
      hadapt_mem->small_nef = SMALL_NEF;
      hadapt_mem->etacf     = ETACF;
      hadapt_mem->pq        = PQ;
      step_mem->nlscoef     = SUN_RCONST(0.22);
      step_mem->crdown      = SUN_RCONST(0.17);
      step_mem->rdiv        = SUN_RCONST(2.3);
      step_mem->dgmax       = SUN_RCONST(0.19);
      step_mem->msbp        = 60;
      break;
    case 4:
      hadapt_mem->hcontroller = SUNAdaptController_PID(ark_mem->sunctx);
      if (hadapt_mem->hcontroller == NULL)
      {
        arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                        "SUNAdaptController_PID allocation failure");
        return (ARK_MEM_FAIL);
      }
      (void)SUNAdaptController_SetErrorBias(hadapt_mem->hcontroller,
                                            SUN_RCONST(1.2));
      (void)SUNAdaptController_SetParams_PID(hadapt_mem->hcontroller,
                                             SUN_RCONST(0.535),
                                             -SUN_RCONST(0.209),
                                             SUN_RCONST(0.148));
      hadapt_mem->safety    = SUN_RCONST(0.988);
      hadapt_mem->growth    = SUN_RCONST(31.5);
      hadapt_mem->etamxf    = SUN_RCONST(0.33);
      hadapt_mem->small_nef = SMALL_NEF;
      hadapt_mem->etacf     = ETACF;
      hadapt_mem->pq        = PQ;
      step_mem->nlscoef     = SUN_RCONST(0.24);
      step_mem->crdown      = SUN_RCONST(0.26);
      step_mem->rdiv        = SUN_RCONST(2.3);
      step_mem->dgmax       = SUN_RCONST(0.16);
      step_mem->msbp        = 31;
      break;
    case 5:
      hadapt_mem->hcontroller = SUNAdaptController_PID(ark_mem->sunctx);
      if (hadapt_mem->hcontroller == NULL)
      {
        arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                        "SUNAdaptController_PID allocation failure");
        return (ARK_MEM_FAIL);
      }
      (void)SUNAdaptController_SetErrorBias(hadapt_mem->hcontroller,
                                            SUN_RCONST(3.3));
      (void)SUNAdaptController_SetParams_PID(hadapt_mem->hcontroller,
                                             SUN_RCONST(0.56), -SUN_RCONST(0.338),
                                             SUN_RCONST(0.14));
      hadapt_mem->safety    = SUN_RCONST(0.937);
      hadapt_mem->growth    = SUN_RCONST(22.0);
      hadapt_mem->etamxf    = SUN_RCONST(0.44);
      hadapt_mem->small_nef = SMALL_NEF;
      hadapt_mem->etacf     = ETACF;
      hadapt_mem->pq        = PQ;
      step_mem->nlscoef     = SUN_RCONST(0.25);
      step_mem->crdown      = SUN_RCONST(0.4);
      step_mem->rdiv        = SUN_RCONST(2.3);
      step_mem->dgmax       = SUN_RCONST(0.32);
      step_mem->msbp        = 31;
      break;
    }

    /*    imex */
  }
  else
  {
    switch (step_mem->q)
    {
    case 2: /* just use standard defaults since better ones unknown */
      hadapt_mem->hcontroller = SUNAdaptController_PID(ark_mem->sunctx);
      if (hadapt_mem->hcontroller == NULL)
      {
        arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                        "SUNAdaptController_PID allocation failure");
        return (ARK_MEM_FAIL);
      }
      hadapt_mem->safety    = SAFETY;
      hadapt_mem->growth    = GROWTH;
      hadapt_mem->etamxf    = ETAMXF;
      hadapt_mem->small_nef = SMALL_NEF;
      hadapt_mem->etacf     = ETACF;
      hadapt_mem->pq        = PQ;
      step_mem->nlscoef     = SUN_RCONST(0.001);
      step_mem->maxcor      = 5;
      step_mem->crdown      = CRDOWN;
      step_mem->rdiv        = RDIV;
      step_mem->dgmax       = DGMAX;
      step_mem->msbp        = MSBP;
      break;
    case 3:
      hadapt_mem->hcontroller = SUNAdaptController_PID(ark_mem->sunctx);
      if (hadapt_mem->hcontroller == NULL)
      {
        arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                        "SUNAdaptController_PID allocation failure");
        return (ARK_MEM_FAIL);
      }
      (void)SUNAdaptController_SetErrorBias(hadapt_mem->hcontroller,
                                            SUN_RCONST(1.42));
      (void)SUNAdaptController_SetParams_PID(hadapt_mem->hcontroller,
                                             SUN_RCONST(0.54), -SUN_RCONST(0.36),
                                             SUN_RCONST(0.14));
      hadapt_mem->safety    = SUN_RCONST(0.965);
      hadapt_mem->growth    = SUN_RCONST(28.7);
      hadapt_mem->etamxf    = SUN_RCONST(0.46);
      hadapt_mem->small_nef = SMALL_NEF;
      hadapt_mem->etacf     = ETACF;
      hadapt_mem->pq        = PQ;
      step_mem->nlscoef     = SUN_RCONST(0.22);
      step_mem->crdown      = SUN_RCONST(0.17);
      step_mem->rdiv        = SUN_RCONST(2.3);
      step_mem->dgmax       = SUN_RCONST(0.19);
      step_mem->msbp        = 60;
      break;
    case 4:
      hadapt_mem->hcontroller = SUNAdaptController_PID(ark_mem->sunctx);
      if (hadapt_mem->hcontroller == NULL)
      {
        arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                        "SUNAdaptController_PID allocation failure");
        return (ARK_MEM_FAIL);
      }
      (void)SUNAdaptController_SetErrorBias(hadapt_mem->hcontroller,
                                            SUN_RCONST(1.35));
      (void)SUNAdaptController_SetParams_PID(hadapt_mem->hcontroller,
                                             SUN_RCONST(0.543),
                                             -SUN_RCONST(0.297),
                                             SUN_RCONST(0.14));
      hadapt_mem->safety    = SUN_RCONST(0.97);
      hadapt_mem->growth    = SUN_RCONST(25.0);
      hadapt_mem->etamxf    = SUN_RCONST(0.47);
      hadapt_mem->small_nef = SMALL_NEF;
      hadapt_mem->etacf     = ETACF;
      hadapt_mem->pq        = PQ;
      step_mem->nlscoef     = SUN_RCONST(0.24);
      step_mem->crdown      = SUN_RCONST(0.26);
      step_mem->rdiv        = SUN_RCONST(2.3);
      step_mem->dgmax       = SUN_RCONST(0.16);
      step_mem->msbp        = 31;
      break;
    case 5:
      hadapt_mem->hcontroller = SUNAdaptController_PI(ark_mem->sunctx);
      if (hadapt_mem->hcontroller == NULL)
      {
        arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                        "SUNAdaptController_PI allocation failure");
        return (ARK_MEM_FAIL);
      }
      (void)SUNAdaptController_SetErrorBias(hadapt_mem->hcontroller,
                                            SUN_RCONST(1.15));
      (void)SUNAdaptController_SetParams_PI(hadapt_mem->hcontroller,
                                            SUN_RCONST(0.8), -SUN_RCONST(0.35));
      hadapt_mem->safety    = SUN_RCONST(0.993);
      hadapt_mem->growth    = SUN_RCONST(28.5);
      hadapt_mem->etamxf    = SUN_RCONST(0.3);
      hadapt_mem->small_nef = SMALL_NEF;
      hadapt_mem->etacf     = ETACF;
      hadapt_mem->pq        = PQ;
      step_mem->nlscoef     = SUN_RCONST(0.25);
      step_mem->crdown      = SUN_RCONST(0.4);
      step_mem->rdiv        = SUN_RCONST(2.3);
      step_mem->dgmax       = SUN_RCONST(0.32);
      step_mem->msbp        = 31;
      break;
    }
    hadapt_mem->owncontroller = SUNTRUE;

    retval = SUNAdaptController_Space(hadapt_mem->hcontroller, &lenrw, &leniw);
    if (retval == SUN_SUCCESS)
    {
      ark_mem->liw += leniw;
      ark_mem->lrw += lenrw;
    }
  }
  return (ARK_SUCCESS);
}